

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall
Clasp::SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject> *this,
          MinimalityCheck *x)

{
  MinimalityCheck *pMVar1;
  
  pMVar1 = (MinimalityCheck *)(this->ptr_ & 0xfffffffffffffffe);
  if ((this->ptr_ & 1) != 0 && pMVar1 != x) {
    this->ptr_ = (uintp)pMVar1;
    operator_delete(pMVar1);
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}